

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

int cargo_set_option_descriptionv(cargo_t ctx,char *optname,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  char **strp;
  size_t opt_i;
  size_t name_i;
  
  opt_i = 0;
  name_i = 0;
  if (ctx != (cargo_t)0x0) {
    iVar1 = _cargo_find_option_name(ctx,optname,&opt_i,&name_i);
    if (iVar1 == 0) {
      strp = &ctx->options[opt_i].description;
      _cargo_xfree(strp);
      iVar1 = cargo_vasprintf(strp,fmt,ap);
      iVar1 = iVar1 >> 0x1f;
    }
    else {
      iVar1 = -1;
    }
    return iVar1;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x1568,
                "int cargo_set_option_descriptionv(cargo_t, const char *, const char *, struct __va_list_tag *)"
               );
}

Assistant:

int cargo_set_option_descriptionv(cargo_t ctx,
                                  const char *optname,
                                  const char *fmt, va_list ap)
{
    int ret = 0;
    size_t opt_i = 0;
    size_t name_i = 0;
    cargo_opt_t *opt = NULL;
    assert(ctx);

    if (_cargo_find_option_name(ctx, optname, &opt_i, &name_i))
    {
        CARGODBG(1, "Failed to find option \"%s\"\n", optname);
        return -1;
    }

    opt = &ctx->options[opt_i];

    _cargo_xfree(&opt->description);

    ret = cargo_vasprintf(&opt->description, fmt, ap);
    return (ret >= 0) ? 0 : -1;
}